

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

int is_character(int c)

{
  undefined4 local_c;
  int c_local;
  
  if ((c < 0x41) || (0x5a < c)) {
    if ((c < 0x61) || (0x7a < c)) {
      if (c == 0x5f) {
        local_c = 1;
      }
      else {
        local_c = 0;
      }
    }
    else {
      local_c = 1;
    }
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

int is_character(int c)
{
  if (c >= 'A' && c <= 'Z')
    return 1;
  if (c >= 'a' && c <= 'z')
    return 1;
  if (c == '_')
    return 1;
  return 0;
}